

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>
::Set_column<std::vector<int,std::allocator<int>>>
          (Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>
           *this,Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                 *column,Index columnIndex,vector<int,_std::allocator<int>_> *rowContainer,
          Column_settings *colSettings)

{
  Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *this_00;
  bool bVar1;
  ID_index rowIndex;
  reference ppEVar2;
  Entry_constructor *local_90;
  Field_operators *local_80;
  iterator local_58;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *local_50;
  Entry *entry;
  iterator __end0;
  iterator __begin0;
  Column_support *__range3;
  Column_settings *colSettings_local;
  vector<int,_std::allocator<int>_> *rowContainer_local;
  Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *pSStack_18;
  Index columnIndex_local;
  Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *column_local;
  Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *this_local;
  
  colSettings_local = (Column_settings *)rowContainer;
  rowContainer_local._4_4_ = columnIndex;
  pSStack_18 = column;
  column_local = (Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                  *)this;
  Dummy_row_access::Dummy_row_access<unsigned_int,std::vector<int,std::allocator<int>>*>
            ((Dummy_row_access *)this,columnIndex,
             (vector<int,_std::allocator<int>_> **)&colSettings_local);
  std::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
  ::set((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
         *)this);
  this_00 = pSStack_18;
  if (colSettings == (Column_settings *)0x0) {
    local_80 = pSStack_18->operators_;
  }
  else {
    local_80 = (Field_operators *)0x0;
  }
  *(Field_operators **)(this + 0x30) = local_80;
  local_90 = (Entry_constructor *)colSettings;
  if (colSettings == (Column_settings *)0x0) {
    local_90 = pSStack_18->entryPool_;
  }
  *(Entry_constructor **)(this + 0x38) = local_90;
  __end0 = std::
           set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
           ::begin(&pSStack_18->column_);
  entry = (Entry *)std::
                   set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
                   ::end(&this_00->column_);
  while (bVar1 = std::operator!=(&__end0,(_Self *)&entry), bVar1) {
    ppEVar2 = std::
              _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>
              ::operator*(&__end0);
    local_50 = *ppEVar2;
    rowIndex = Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
               ::get_row_index(local_50);
    local_58 = std::
               set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
               ::end((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
                      *)this);
    Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
    ::_insert_entry((Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                     *)this,rowIndex,&local_58);
    std::
    _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

inline Set_column<Master_matrix>::Set_column(const Set_column& column,
                                             Index columnIndex,
                                             Row_container* rowContainer,
                                             Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  for (const Entry* entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _insert_entry(entry->get_row_index(), column_.end());
    } else {
      _insert_entry(entry->get_element(), entry->get_row_index(), column_.end());
    }
  }
}